

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInProgram(SyntaxKind kind)

{
  int in_EDI;
  SyntaxKind in_stack_fffffffffffffff0;
  bool local_1;
  
  if (((((in_EDI == 0x3c) || (in_EDI == 0x47)) || (in_EDI == 0x57)) ||
      ((((in_EDI == 0x68 || (in_EDI == 0xcf)) ||
        ((in_EDI - 0xddU < 2 || ((in_EDI == 0xe3 || (in_EDI == 0xe8)))))) || (in_EDI == 0xfb)))) ||
     (((in_EDI == 0x11f || (in_EDI == 0x16f)) || (in_EDI == 0x1d1)))) {
    local_1 = true;
  }
  else {
    local_1 = isModuleCommonDecl(in_stack_fffffffffffffff0);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAllowedInProgram(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::ConcurrentAssertionMember:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::GenerateBlock:
            return true;
        default:
            return isModuleCommonDecl(kind);
    }
}